

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O2

void tcg_gen_extract_i64_mips64
               (TCGContext_conflict5 *tcg_ctx,TCGv_i64 ret,TCGv_i64 arg,uint ofs,uint len)

{
  int iVar1;
  TCGOp *pTVar2;
  ulong arg2;
  uintptr_t o;
  
  iVar1 = ofs + len;
  if (iVar1 == 0x40) {
    arg2 = (ulong)(0x40 - len);
  }
  else {
    if (ofs == 0) {
LAB_007ab920:
      tcg_gen_andi_i64_mips64(tcg_ctx,ret,arg,~(-1L << ((byte)len & 0x3f)));
      return;
    }
    if (len == 8 && ofs == 8 || iVar1 == 0x20) {
      pTVar2 = tcg_emit_op_mips64(tcg_ctx,INDEX_op_extract_i64);
      pTVar2->args[0] = (TCGArg)(ret + (long)tcg_ctx);
      pTVar2->args[1] = (TCGArg)(arg + (long)tcg_ctx);
      pTVar2->args[2] = (ulong)ofs;
      pTVar2->args[3] = (ulong)len;
      return;
    }
    if (iVar1 == 8) {
      tcg_gen_ext8u_i64_mips64(tcg_ctx,ret,arg);
    }
    else if (iVar1 == 0x10) {
      tcg_gen_ext16u_i64_mips64(tcg_ctx,ret,arg);
    }
    else {
      if (iVar1 != 0x20) {
        if ((0x20 < len) || ((0x1000101feU >> ((ulong)len & 0x3f) & 1) == 0)) {
          arg2 = (ulong)(0x40 - len);
          tcg_gen_shli_i64_mips64(tcg_ctx,ret,arg,(ulong)((0x40 - len) - ofs));
          arg = ret;
          goto LAB_007ab8a2;
        }
        tcg_gen_shri_i64_mips64(tcg_ctx,ret,arg,(ulong)ofs);
        arg = ret;
        goto LAB_007ab920;
      }
      tcg_gen_ext32u_i64_mips64(tcg_ctx,ret,arg);
    }
    arg2 = (ulong)ofs;
    arg = ret;
  }
LAB_007ab8a2:
  tcg_gen_shri_i64_mips64(tcg_ctx,ret,arg,arg2);
  return;
}

Assistant:

void tcg_gen_extract_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i64 arg,
                         unsigned int ofs, unsigned int len)
{
    tcg_debug_assert(ofs < 64);
    tcg_debug_assert(len > 0);
    tcg_debug_assert(len <= 64);
    tcg_debug_assert(ofs + len <= 64);

    /* Canonicalize certain special cases, even if extract is supported.  */
    if (ofs + len == 64) {
        tcg_gen_shri_i64(tcg_ctx, ret, arg, 64 - len);
        return;
    }
    if (ofs == 0) {
        tcg_gen_andi_i64(tcg_ctx, ret, arg, (1ull << len) - 1);
        return;
    }

#if TCG_TARGET_REG_BITS == 32
        /* Look for a 32-bit extract within one of the two words.  */
        if (ofs >= 32) {
            tcg_gen_extract_i32(tcg_ctx, TCGV_LOW(tcg_ctx, ret), TCGV_HIGH(tcg_ctx, arg), ofs - 32, len);
            tcg_gen_movi_i32(tcg_ctx, TCGV_HIGH(tcg_ctx, ret), 0);
            return;
        }
        if (ofs + len <= 32) {
            tcg_gen_extract_i32(tcg_ctx, TCGV_LOW(tcg_ctx, ret), TCGV_LOW(tcg_ctx, arg), ofs, len);
            tcg_gen_movi_i32(tcg_ctx, TCGV_HIGH(tcg_ctx, ret), 0);
            return;
        }
        /* The field is split across two words.  One double-word
           shift is better than two double-word shifts.  */
        goto do_shift_and;
#endif

#if TCG_TARGET_HAS_extract_i64
    if (TCG_TARGET_extract_i64_valid(ofs, len)) {
        tcg_gen_op4ii_i64(tcg_ctx, INDEX_op_extract_i64, ret, arg, ofs, len);
        return;
    }
#endif

    /* Assume that zero-extension, if available, is cheaper than a shift.  */
    switch (ofs + len) {
    case 32:
#if TCG_TARGET_HAS_ext32u_i64
            tcg_gen_ext32u_i64(tcg_ctx, ret, arg);
            tcg_gen_shri_i64(tcg_ctx, ret, ret, ofs);
            return;
#endif
        break;
    case 16:
#if TCG_TARGET_HAS_ext16u_i64
            tcg_gen_ext16u_i64(tcg_ctx, ret, arg);
            tcg_gen_shri_i64(tcg_ctx, ret, ret, ofs);
            return;
#endif
        break;
    case 8:
#if TCG_TARGET_HAS_ext8u_i64
            tcg_gen_ext8u_i64(tcg_ctx, ret, arg);
            tcg_gen_shri_i64(tcg_ctx, ret, ret, ofs);
            return;
#endif
        break;
    }

    /* ??? Ideally we'd know what values are available for immediate AND.
       Assume that 8 bits are available, plus the special cases of 16 and 32,
       so that we get ext8u, ext16u, and ext32u.  */
    switch (len) {
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
    case 16:
    case 32:
#if TCG_TARGET_REG_BITS == 32
    do_shift_and:
#endif
        tcg_gen_shri_i64(tcg_ctx, ret, arg, ofs);
        tcg_gen_andi_i64(tcg_ctx, ret, ret, (1ull << len) - 1);
        break;
    default:
        tcg_gen_shli_i64(tcg_ctx, ret, arg, 64 - len - ofs);
        tcg_gen_shri_i64(tcg_ctx, ret, ret, 64 - len);
        break;
    }
}